

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::CheckDecorationsFromDecoration(ValidationState_t *vstate)

{
  uint32_t id_00;
  bool bVar1;
  bool bVar2;
  Op OVar3;
  Decoration DVar4;
  spv_result_t sVar5;
  map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
  *this;
  reference ppVar6;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *this_00;
  Instruction *this_01;
  reference this_02;
  spv_result_t e__LINE___7;
  spv_result_t e__LINE___6;
  spv_result_t e__LINE___5;
  spv_result_t e__LINE___4;
  spv_result_t e__LINE___3;
  spv_result_t e__LINE___2;
  spv_result_t e__LINE___1;
  spv_result_t e__LINE__;
  Decoration *decoration;
  iterator __end3;
  iterator __begin3;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *__range3;
  Instruction *inst;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *decorations;
  uint32_t id;
  pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>
  *kv;
  const_iterator __end2;
  const_iterator __begin2;
  map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
  *__range2;
  bool is_shader;
  ValidationState_t *vstate_local;
  
  bVar1 = ValidationState_t::HasCapability(vstate,Shader);
  this = ValidationState_t::id_decorations(vstate);
  __end2 = std::
           map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
           ::begin(this);
  kv = (pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>
        *)std::
          map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
          ::end(this);
  do {
    bVar2 = std::operator!=(&__end2,(_Self *)&kv);
    if (!bVar2) {
      return SPV_SUCCESS;
    }
    ppVar6 = std::
             _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>
             ::operator*(&__end2);
    id_00 = ppVar6->first;
    this_00 = &ppVar6->second;
    bVar2 = std::
            set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
            ::empty(this_00);
    if (!bVar2) {
      this_01 = ValidationState_t::FindDef(vstate,id_00);
      if (this_01 == (Instruction *)0x0) {
        __assert_fail("inst",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                      ,0x7d7,
                      "spv_result_t spvtools::val::(anonymous namespace)::CheckDecorationsFromDecoration(ValidationState_t &)"
                     );
      }
      OVar3 = Instruction::opcode(this_01);
      if (OVar3 != OpDecorationGroup) {
        __end3 = std::
                 set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                 ::begin(this_00);
        decoration = (Decoration *)
                     std::
                     set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                     ::end(this_00);
        while (bVar2 = std::operator!=(&__end3,(_Self *)&decoration), bVar2) {
          this_02 = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator*(&__end3);
          DVar4 = Decoration::dec_type(this_02);
          if (DVar4 == RelaxedPrecision) {
            sVar5 = CheckRelaxPrecisionDecoration(vstate,this_01,this_02);
joined_r0x005395fb:
            if (sVar5 != SPV_SUCCESS) {
              return sVar5;
            }
          }
          else {
            if (DVar4 - Block < 2) {
              sVar5 = CheckBlockDecoration(vstate,this_01,this_02);
              goto joined_r0x005395fb;
            }
            if (DVar4 == NonWritable) {
              sVar5 = CheckNonWritableDecoration(vstate,this_01,this_02);
              goto joined_r0x005395fb;
            }
            if (DVar4 - Uniform < 2) {
              sVar5 = CheckUniformDecoration(vstate,this_01,this_02);
              goto joined_r0x005395fb;
            }
            if (DVar4 == Location) {
              sVar5 = CheckLocationDecoration(vstate,this_01,this_02);
              goto joined_r0x005395fb;
            }
            if (DVar4 == Component) {
              sVar5 = CheckComponentDecoration(vstate,this_01,this_02);
              goto joined_r0x005395fb;
            }
            if (DVar4 == FPRoundingMode) {
              if (bVar1) {
                sVar5 = CheckFPRoundingModeForShaders(vstate,this_01,this_02);
                goto joined_r0x005395fb;
              }
            }
            else if (DVar4 - NoSignedWrap < 2) {
              sVar5 = CheckIntegerWrapDecoration(vstate,this_01,this_02);
              goto joined_r0x005395fb;
            }
          }
          std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator++(&__end3);
        }
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

spv_result_t CheckDecorationsFromDecoration(ValidationState_t& vstate) {
  // Some rules are only checked for shaders.
  const bool is_shader = vstate.HasCapability(spv::Capability::Shader);

  for (const auto& kv : vstate.id_decorations()) {
    const uint32_t id = kv.first;
    const auto& decorations = kv.second;
    if (decorations.empty()) continue;

    const Instruction* inst = vstate.FindDef(id);
    assert(inst);

    // We assume the decorations applied to a decoration group have already
    // been propagated down to the group members.
    if (inst->opcode() == spv::Op::OpDecorationGroup) continue;

    for (const auto& decoration : decorations) {
      switch (decoration.dec_type()) {
        case spv::Decoration::Component:
          PASS_OR_BAIL(CheckComponentDecoration(vstate, *inst, decoration));
          break;
        case spv::Decoration::FPRoundingMode:
          if (is_shader)
            PASS_OR_BAIL(
                CheckFPRoundingModeForShaders(vstate, *inst, decoration));
          break;
        case spv::Decoration::NonWritable:
          PASS_OR_BAIL(CheckNonWritableDecoration(vstate, *inst, decoration));
          break;
        case spv::Decoration::Uniform:
        case spv::Decoration::UniformId:
          PASS_OR_BAIL(CheckUniformDecoration(vstate, *inst, decoration));
          break;
        case spv::Decoration::NoSignedWrap:
        case spv::Decoration::NoUnsignedWrap:
          PASS_OR_BAIL(CheckIntegerWrapDecoration(vstate, *inst, decoration));
          break;
        case spv::Decoration::Block:
        case spv::Decoration::BufferBlock:
          PASS_OR_BAIL(CheckBlockDecoration(vstate, *inst, decoration));
          break;
        case spv::Decoration::Location:
          PASS_OR_BAIL(CheckLocationDecoration(vstate, *inst, decoration));
          break;
        case spv::Decoration::RelaxedPrecision:
          PASS_OR_BAIL(
              CheckRelaxPrecisionDecoration(vstate, *inst, decoration));
          break;
        default:
          break;
      }
    }
  }
  return SPV_SUCCESS;
}